

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O2

void libcmepoll_LTX_write_select
               (CMtrans_services_conflict svc,select_data_ptr *sdp,int fd,select_list_func func,
               void *arg1,void *arg2)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  FunctionListElement *pFVar4;
  FunctionListElement *pFVar5;
  uint *puVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  char *__format;
  FILE *__stream;
  select_data_ptr sd;
  long lVar10;
  epoll_event ep_event;
  
  sd = *sdp;
  if (sd == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager)0x0);
    sd = *sdp;
  }
  if ((sd->cm != (CManager)0x0) &&
     (iVar3 = (*svc->return_CM_lock_status)
                        (sd->cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0x217), iVar3 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0x217,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  ep_event.data.u64._4_4_ = 0;
  ep_event._0_8_ = 0;
  sd->select_consistency_number = sd->select_consistency_number + 1;
  lVar10 = (long)fd;
  if (sd->sel_item_max < fd) {
    sVar8 = (size_t)(fd * 0x18 + 0x18);
    pFVar4 = (FunctionListElement *)(*svc->realloc_func)(sd->select_items,sVar8);
    sd->select_items = pFVar4;
    pFVar5 = (FunctionListElement *)(*svc->realloc_func)(sd->write_items,sVar8);
    sd->write_items = pFVar5;
    pFVar4 = sd->select_items;
    if ((pFVar4 == (FunctionListElement *)0x0) || (pFVar5 == (FunctionListElement *)0x0)) {
      perror("Realloc failed\n");
      exit(1);
    }
    lVar7 = (long)sd->sel_item_max;
    lVar9 = lVar7 * 0x18;
    for (; lVar7 < lVar10; lVar7 = lVar7 + 1) {
      puVar1 = (undefined8 *)((long)&pFVar5[1].func + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pFVar5[1].arg2 + lVar9) = 0;
      puVar1 = (undefined8 *)((long)&pFVar4[1].func + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pFVar4[1].arg2 + lVar9) = 0;
      lVar9 = lVar9 + 0x18;
    }
    sd->sel_item_max = fd;
  }
  ep_event.data.fd = fd;
  if (func == (select_list_func)0x0) {
    if (sd->select_items[lVar10].func == (select_list_func)0x0) {
      iVar3 = epoll_ctl(sd->epfd,2,fd,(epoll_event *)&ep_event);
      __stream = _stderr;
      if (-1 < iVar3) goto LAB_0010178b;
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      __format = "Something bad happened in %s. %d\n";
    }
    else {
      ep_event.events = 1;
      iVar3 = epoll_ctl(sd->epfd,3,fd,(epoll_event *)&ep_event);
      __stream = _stderr;
      if (-1 < iVar3) goto LAB_0010178b;
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      __format = "Something bad in %s. %d\n";
    }
  }
  else {
    ep_event.events = 4;
    iVar3 = epoll_ctl(sd->epfd,1,fd,(epoll_event *)&ep_event);
    if (-1 < iVar3) goto LAB_0010178b;
    puVar6 = (uint *)__errno_location();
    uVar2 = *puVar6;
    if (uVar2 == 0x11) {
      ep_event.events = 5;
      iVar3 = epoll_ctl(sd->epfd,3,fd,(epoll_event *)&ep_event);
      if (-1 < iVar3) goto LAB_0010178b;
      uVar2 = *puVar6;
    }
    __format = "Something bad in %s. %d\n";
    __stream = _stderr;
  }
  fprintf(__stream,__format,"libcmepoll_LTX_write_select",(ulong)uVar2);
LAB_0010178b:
  pFVar4 = sd->write_items;
  pFVar4[lVar10].func = func;
  pFVar4[lVar10].arg1 = arg1;
  pFVar4[lVar10].arg2 = arg2;
  wake_server_thread(sd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_write_select(CMtrans_services svc, select_data_ptr *sdp, int fd, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    struct epoll_event ep_event;

    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    memset(&ep_event, 0, sizeof(ep_event));
    sd->select_consistency_number++;
    if (fd > sd->sel_item_max) {
	int i;
	int size = (fd+1)*sizeof(sd->select_items[0]);
	sd->select_items = 
	    (FunctionListElement *) svc->realloc_func(sd->select_items, size);
	sd->write_items = 
	    (FunctionListElement *) svc->realloc_func(sd->write_items, size);
	if ((sd->select_items == NULL) || (sd->write_items == NULL)) {
	    perror("Realloc failed\n");
	    exit(1);
	}

	for (i = sd->sel_item_max + 1; i <= fd; i++) {
	    sd->write_items[i].func = NULL;
	    sd->write_items[i].arg1 = NULL;
	    sd->write_items[i].arg2 = NULL;
	    sd->select_items[i].func = NULL;
	    sd->select_items[i].arg1 = NULL;
	    sd->select_items[i].arg2 = NULL;
	}
	sd->sel_item_max = fd;
    }
    ep_event.data.fd = fd;
    if(func != NULL) {
    	ep_event.events = EPOLLOUT;
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_ADD, fd, &ep_event) < 0) {
    		if(errno == EEXIST) {
    		    /* This is fd is already armed for read */
    		    ep_event.events = EPOLLIN | EPOLLOUT;
    		    if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    		    	fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		    }
    		} else {
    		    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		}
    	}
    } else if(sd->select_items[fd].func) {
    	/* This fd should stay armed for read */
    	ep_event.events = EPOLLIN;
    	if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    	}
	} else {
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_DEL, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
    	}
    }

    sd->write_items[fd].func = func;
    sd->write_items[fd].arg1 = arg1;
    sd->write_items[fd].arg2 = arg2;
    wake_server_thread(sd);
}